

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

void __thiscall cppcms::application_specific_pool::_pool_policy::~_pool_policy(_pool_policy *this)

{
  void *in_RDI;
  _pool_policy *unaff_retaddr;
  
  ~_pool_policy(unaff_retaddr);
  operator_delete(in_RDI);
  return;
}

Assistant:

~_pool_policy()
	{
		for(size_t i=0;i<size_;i++)
			delete apps_[i];
	}